

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorRefinementAmenability.cpp
# Opt level: O3

Labeling * __thiscall
ColorRefinementAmenability::ColorRefinementAmenability::compute_stable_coloring
          (Labeling *__return_storage_ptr__,ColorRefinementAmenability *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *node_colors,
          unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          *colors_to_nodes,
          unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          *node_to_color)

{
  long lVar1;
  iterator iVar2;
  pointer puVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *puVar7;
  Node *n;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *puVar8;
  ulong uVar9;
  __hashtable *__h_1;
  __hashtable *__h;
  bool bVar10;
  Label new_color;
  Nodes neighbors;
  Labels new_coloring;
  Labels coloring;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_colors;
  int local_10c;
  ulong *local_108;
  iterator iStack_100;
  unsigned_long *local_f8;
  Labeling *local_f0;
  size_t local_e8;
  ulong local_e0;
  int local_d4;
  Nodes local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_98;
  Graph *local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_38;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_f0 = __return_storage_ptr__;
  local_98 = &node_colors->_M_h;
  local_90 = &this->m_graph;
  sVar5 = GraphLibrary::Graph::get_num_nodes(&this->m_graph);
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._M_buckets = (__buckets_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_88,sVar5,(value_type_conflict2 *)&local_70);
  local_70._M_buckets = (__buckets_ptr)0x1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&local_b8,sVar5,(value_type_conflict2 *)&local_70);
  local_10c = 1;
  local_e8 = sVar5;
  while( true ) {
    while( true ) {
      sVar5 = local_e8;
      local_70._M_buckets = &local_70._M_single_bucket;
      local_70._M_bucket_count = 1;
      local_70._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_70._M_element_count = 0;
      local_70._M_rehash_policy._M_max_load_factor = 1.0;
      local_70._M_rehash_policy._M_next_resize = 0;
      local_70._M_single_bucket = (__node_base_ptr)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&local_88,&local_b8);
      if (sVar5 != 0) {
        uVar9 = 0;
        do {
          local_108 = (ulong *)0x0;
          iStack_100._M_current = (unsigned_long *)0x0;
          local_f8 = (unsigned_long *)0x0;
          GraphLibrary::Graph::get_neighbours(&local_d0,local_90,(Node)uVar9);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                     ((long)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) + 1);
          puVar3 = local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (puVar8 = (unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                         *)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              iVar2._M_current = iStack_100._M_current, puVar7 = local_108,
              puVar8 != (unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                         *)puVar3;
              puVar8 = (unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                        *)((long)&(puVar8->_M_h)._M_buckets + 4)) {
            if (iStack_100._M_current == local_f8) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                         iStack_100,
                         local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         *(uint *)&(puVar8->_M_h)._M_buckets);
            }
            else {
              *iStack_100._M_current =
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[*(uint *)&(puVar8->_M_h)._M_buckets];
              iStack_100._M_current = iStack_100._M_current + 1;
            }
          }
          if (local_108 != iStack_100._M_current) {
            uVar6 = (long)iStack_100._M_current - (long)local_108 >> 3;
            lVar1 = 0x3f;
            if (uVar6 != 0) {
              for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_108,iStack_100._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar7,iVar2._M_current);
          }
          if (iStack_100._M_current == local_f8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,iStack_100,
                       local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar9);
          }
          else {
            *iStack_100._M_current =
                 local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
            iStack_100._M_current = iStack_100._M_current + 1;
          }
          local_e0 = iStack_100._M_current[-1];
          iStack_100._M_current = iStack_100._M_current + -1;
          for (puVar7 = local_108; puVar7 != iStack_100._M_current; puVar7 = puVar7 + 1) {
            uVar6 = *puVar7;
            if (local_e0 < uVar6) {
              local_e0 = local_e0 + uVar6 * uVar6;
            }
            else {
              local_e0 = (local_e0 + 1) * local_e0 + uVar6;
            }
          }
          local_38 = &local_70;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_38,&local_e0,&local_38);
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] = local_e0;
          if ((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               *)local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start !=
              (unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               *)0x0) {
            operator_delete(local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_108 != (ulong *)0x0) {
            operator_delete(local_108);
          }
          uVar9 = (ulong)((Node)uVar9 + 1);
        } while (uVar9 < local_e8);
      }
      iVar4 = (int)local_70._M_element_count;
      if (local_10c == (int)local_70._M_element_count) break;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_70);
      local_10c = iVar4;
    }
    sVar5 = GraphLibrary::Graph::get_num_nodes(local_90);
    if (&local_70 != local_98) {
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_98,&local_70);
    }
    if ((int)sVar5 == 0) break;
    local_d4 = iVar4;
    uVar9 = 0;
    do {
      local_108 = (ulong *)local_b8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar9];
      iStack_100._M_current._0_4_ = (int)uVar9;
      local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)colors_to_nodes;
      std::__detail::
      _Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
      ::
      _M_insert_range<std::pair<unsigned_long_const,unsigned_int>const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_long_const,unsigned_int>,false>>>>
                ((_Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                  *)colors_to_nodes,
                 (vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,&local_f8,
                 &local_d0);
      local_108 = (ulong *)CONCAT44(local_108._4_4_,(int)uVar9);
      iStack_100._M_current =
           (unsigned_long *)
           local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[uVar9];
      local_d0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)node_to_color;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_insert<std::pair<unsigned_int_const,unsigned_long>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,unsigned_long>,false>>>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)node_to_color,(vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,
                 &local_d0);
      uVar9 = uVar9 + 1;
    } while ((sVar5 & 0xffffffff) != uVar9);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_70);
    bVar10 = local_10c == local_d4;
    local_10c = local_d4;
    if (bVar10) {
LAB_00104c38:
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return local_f0;
    }
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_70);
  goto LAB_00104c38;
}

Assistant:

Labeling ColorRefinementAmenability::compute_stable_coloring(unordered_set<Label> &node_colors,
                                                                 unordered_multimap<Label, Node> &colors_to_nodes,
                                                                 unordered_map<Node, Label> &node_to_color) const {
        Labeling node_label;
        size_t num_nodes = m_graph.get_num_nodes();

        Labels coloring;
        Labels new_coloring;

        // Labels each node with the same label.
        coloring.resize(num_nodes, 0);
        new_coloring.resize(num_nodes, 1);
        uint num_old_colors = -1;
        uint num_new_colors = 1;

        while (num_new_colors != num_old_colors) {
            unordered_set<Label> new_colors;

            // Update coloring.
            coloring = new_coloring;
            num_old_colors = num_new_colors;

            // Iterate over all nodes.
            for (Node v = 0; v < num_nodes; ++v) {
                Labels colors;
                Nodes neighbors(m_graph.get_neighbours(v));
                colors.reserve(neighbors.size() + 1);

                // Get colors of neighbors.
                for (const Node &n: neighbors) {
                    colors.push_back(coloring[n]);
                }
                sort(colors.begin(), colors.end());
                colors.push_back(coloring[v]);

                // Compute new label using composition to bijectively map two integers to on integer.ŧ
                Label new_color = colors.back();
                colors.pop_back();
                for (const Label &c: colors) {
                    new_color = pairing(new_color, c);
                }

                new_colors.insert(new_color);
                new_coloring[v] = new_color;

            }

            num_new_colors = new_colors.size();
            if (num_new_colors == num_old_colors) {
                uint num_nodes = m_graph.get_num_nodes();

                node_colors = new_colors;

                for (Node i = 0; i < num_nodes; ++i) {
                    colors_to_nodes.insert({{new_coloring[i], i}});
                    node_to_color.insert({{i, new_coloring[i]}});
                }
            }

        }

        return node_label;
    }